

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O3

int sgemv_(char *trans,integer *m,integer *n,real *alpha,real *a,integer *lda,real *x,integer *incx,
          real *beta,real *y,integer *incy)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  integer iVar8;
  logical lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint *puVar14;
  float *pfVar15;
  ulong uVar16;
  real *prVar17;
  long lVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  int iVar23;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  int iVar26;
  undefined1 auVar25 [16];
  
  uVar16 = (ulong)*lda;
  sgemv_::info = 0;
  lVar9 = lsame_(trans,"N");
  if (((lVar9 == 0) && (lVar9 = lsame_(trans,"T"), lVar9 == 0)) &&
     (lVar9 = lsame_(trans,"C"), lVar9 == 0)) {
    iVar8 = 1;
  }
  else {
    iVar1 = *m;
    if (iVar1 < 0) {
      iVar8 = 2;
    }
    else if (*n < 0) {
      iVar8 = 3;
    }
    else {
      iVar8 = 6;
      if ((int)(iVar1 + (uint)(iVar1 == 0)) <= *lda) {
        if (*incx == 0) {
          iVar8 = 8;
        }
        else if (*incy == 0) {
          iVar8 = 0xb;
        }
        else {
          iVar8 = sgemv_::info;
          if (sgemv_::info == 0) {
            if (*n == 0 || iVar1 == 0) {
              return 0;
            }
            if (((*alpha == 0.0) && (!NAN(*alpha))) && ((*beta == 1.0 && (!NAN(*beta))))) {
              return 0;
            }
            lVar9 = lsame_(trans,"N");
            auVar7 = _DAT_00121040;
            auVar6 = _DAT_0011ec90;
            auVar5 = _DAT_0011ec80;
            puVar14 = (uint *)m;
            piVar4 = n;
            if (lVar9 == 0) {
              puVar14 = (uint *)n;
              piVar4 = m;
            }
            uVar13 = *puVar14;
            uVar12 = (ulong)uVar13;
            iVar1 = 1 - (*piVar4 + -1) * *incx;
            if (0 < *incx) {
              iVar1 = 1;
            }
            iVar23 = *incy;
            lVar10 = (long)iVar23;
            iVar3 = 1 - (uVar13 - 1) * iVar23;
            if (0 < lVar10) {
              iVar3 = 1;
            }
            fVar20 = *beta;
            if ((fVar20 != 1.0) || (NAN(fVar20))) {
              if (iVar23 == 1) {
                if ((fVar20 != 0.0) || (NAN(fVar20))) {
                  if (0 < (int)uVar13) {
                    uVar11 = 0;
                    do {
                      y[uVar11] = *beta * y[uVar11];
                      uVar11 = uVar11 + 1;
                    } while (uVar12 != uVar11);
                  }
                }
                else if (0 < (int)uVar13) {
                  memset(y,0,uVar12 * 4);
                }
              }
              else if ((fVar20 != 0.0) || (NAN(fVar20))) {
                if (0 < (int)uVar13) {
                  pfVar15 = y + (long)iVar3 + -1;
                  do {
                    *pfVar15 = *beta * *pfVar15;
                    pfVar15 = pfVar15 + lVar10;
                    uVar13 = (int)uVar12 - 1;
                    uVar12 = (ulong)uVar13;
                  } while (uVar13 != 0);
                }
              }
              else if (0 < (int)uVar13) {
                lVar18 = uVar12 - 1;
                auVar22._8_4_ = (int)lVar18;
                auVar22._0_8_ = lVar18;
                auVar22._12_4_ = (int)((ulong)lVar18 >> 0x20);
                prVar17 = y + (long)iVar3 + -1;
                uVar12 = 0;
                auVar22 = auVar22 ^ _DAT_0011ec90;
                do {
                  auVar24._8_4_ = (int)uVar12;
                  auVar24._0_8_ = uVar12;
                  auVar24._12_4_ = (int)(uVar12 >> 0x20);
                  auVar25 = (auVar24 | auVar5) ^ auVar6;
                  iVar23 = auVar22._4_4_;
                  if ((bool)(~(auVar25._4_4_ == iVar23 && auVar22._0_4_ < auVar25._0_4_ ||
                              iVar23 < auVar25._4_4_) & 1)) {
                    *prVar17 = 0.0;
                  }
                  if ((auVar25._12_4_ != auVar22._12_4_ || auVar25._8_4_ <= auVar22._8_4_) &&
                      auVar25._12_4_ <= auVar22._12_4_) {
                    prVar17[lVar10] = 0.0;
                  }
                  auVar24 = (auVar24 | auVar7) ^ auVar6;
                  iVar26 = auVar24._4_4_;
                  if (iVar26 <= iVar23 && (iVar26 != iVar23 || auVar24._0_4_ <= auVar22._0_4_)) {
                    prVar17[lVar10 * 2] = 0.0;
                    prVar17[lVar10 * 3] = 0.0;
                  }
                  uVar12 = uVar12 + 4;
                  prVar17 = prVar17 + lVar10 * 4;
                } while ((uVar13 + 3 & 0xfffffffc) != uVar12);
              }
            }
            if ((*alpha == 0.0) && (!NAN(*alpha))) {
              return 0;
            }
            uVar12 = ~uVar16;
            lVar9 = lsame_(trans,"N");
            uVar13 = *n;
            uVar11 = (ulong)uVar13;
            if (lVar9 != 0) {
              iVar23 = *incy;
              if ((long)iVar23 != 1) {
                if ((int)uVar13 < 1) {
                  return 0;
                }
                iVar26 = *incx;
                lVar10 = (long)iVar1;
                prVar17 = a + uVar16 + uVar12;
                lVar18 = 1;
                do {
                  fVar20 = x[lVar10 + -1];
                  if (((fVar20 != 0.0) || (NAN(fVar20))) && (uVar13 = *m, 0 < (int)uVar13)) {
                    fVar21 = *alpha;
                    lVar19 = 1;
                    pfVar15 = y + (long)iVar3 + -1;
                    do {
                      *pfVar15 = prVar17[lVar19] * fVar20 * fVar21 + *pfVar15;
                      lVar19 = lVar19 + 1;
                      pfVar15 = pfVar15 + iVar23;
                    } while ((ulong)uVar13 + 1 != lVar19);
                  }
                  lVar10 = lVar10 + iVar26;
                  lVar18 = lVar18 + 1;
                  prVar17 = prVar17 + uVar16;
                } while (lVar18 != uVar11 + 1);
                return 0;
              }
              if ((int)uVar13 < 1) {
                return 0;
              }
              iVar23 = *incx;
              lVar10 = (long)iVar1;
              prVar17 = a + uVar16 + uVar12 + 1;
              lVar18 = 1;
              do {
                fVar20 = x[lVar10 + -1];
                if (((fVar20 != 0.0) || (NAN(fVar20))) && (uVar13 = *m, 0 < (int)uVar13)) {
                  fVar21 = *alpha;
                  uVar12 = 0;
                  do {
                    y[uVar12] = prVar17[uVar12] * fVar20 * fVar21 + y[uVar12];
                    uVar12 = uVar12 + 1;
                  } while (uVar13 != uVar12);
                }
                lVar10 = lVar10 + iVar23;
                lVar18 = lVar18 + 1;
                prVar17 = prVar17 + uVar16;
              } while (lVar18 != uVar11 + 1);
              return 0;
            }
            iVar23 = *incx;
            if ((long)iVar23 != 1) {
              if ((int)uVar13 < 1) {
                return 0;
              }
              iVar26 = *m;
              iVar2 = *incy;
              lVar10 = (long)iVar3;
              prVar17 = a + uVar16 + uVar12;
              lVar18 = 1;
              do {
                fVar21 = 0.0;
                fVar20 = 0.0;
                if (0 < iVar26) {
                  uVar12 = 1;
                  pfVar15 = x + (long)iVar1 + -1;
                  do {
                    fVar21 = fVar21 + prVar17[uVar12] * *pfVar15;
                    uVar12 = uVar12 + 1;
                    pfVar15 = pfVar15 + iVar23;
                    fVar20 = fVar21;
                  } while (iVar26 + 1 != uVar12);
                }
                y[lVar10 + -1] = fVar20 * *alpha + y[lVar10 + -1];
                lVar10 = lVar10 + iVar2;
                lVar18 = lVar18 + 1;
                prVar17 = prVar17 + uVar16;
              } while (lVar18 != uVar11 + 1);
              return 0;
            }
            if ((int)uVar13 < 1) {
              return 0;
            }
            iVar1 = *m;
            iVar23 = *incy;
            lVar10 = (long)iVar3;
            prVar17 = a + uVar16 + uVar12 + 1;
            lVar18 = 1;
            do {
              fVar20 = 0.0;
              if (0 < iVar1) {
                lVar19 = 0;
                do {
                  fVar20 = fVar20 + prVar17[lVar19] * x[lVar19];
                  lVar19 = lVar19 + 1;
                } while ((ulong)(iVar1 + 1) - 1 != lVar19);
              }
              y[lVar10 + -1] = fVar20 * *alpha + y[lVar10 + -1];
              lVar10 = lVar10 + iVar23;
              lVar18 = lVar18 + 1;
              prVar17 = prVar17 + uVar16;
            } while (lVar18 != uVar11 + 1);
            return 0;
          }
        }
      }
    }
  }
  sgemv_::info = iVar8;
  xerbla_("SGEMV ",&sgemv_::info);
  return 0;
}

Assistant:

int sgemv_(char *trans, integer *m, integer *n, real *alpha,
	real *a, integer *lda, real *x, integer *incx, real *beta, real *y,
	integer *incy)
{
    /* System generated locals */
    integer a_dim1, a_offset, i__1, i__2;

    /* Local variables */
    static integer i__, j, ix, iy, jx, jy, kx, ky, info;
    static real temp;
    static integer lenx, leny;
    extern logical lsame_(char *, char *);
    extern /* Subroutine */ int xerbla_(char *, integer *);


/*
    Purpose
    =======

    SGEMV  performs one of the matrix-vector operations

       y := alpha*A*x + beta*y,   or   y := alpha*A'*x + beta*y,

    where alpha and beta are scalars, x and y are vectors and A is an
    m by n matrix.

    Parameters
    ==========

    TRANS  - CHARACTER*1.
             On entry, TRANS specifies the operation to be performed as
             follows:

                TRANS = 'N' or 'n'   y := alpha*A*x + beta*y.

                TRANS = 'T' or 't'   y := alpha*A'*x + beta*y.

                TRANS = 'C' or 'c'   y := alpha*A'*x + beta*y.

             Unchanged on exit.

    M      - INTEGER.
             On entry, M specifies the number of rows of the matrix A.
             M must be at least zero.
             Unchanged on exit.

    N      - INTEGER.
             On entry, N specifies the number of columns of the matrix A.
             N must be at least zero.
             Unchanged on exit.

    ALPHA  - REAL            .
             On entry, ALPHA specifies the scalar alpha.
             Unchanged on exit.

    A      - REAL             array of DIMENSION ( LDA, n ).
             Before entry, the leading m by n part of the array A must
             contain the matrix of coefficients.
             Unchanged on exit.

    LDA    - INTEGER.
             On entry, LDA specifies the first dimension of A as declared
             in the calling (sub) program. LDA must be at least
             max( 1, m ).
             Unchanged on exit.

    X      - REAL             array of DIMENSION at least
             ( 1 + ( n - 1 )*abs( INCX ) ) when TRANS = 'N' or 'n'
             and at least
             ( 1 + ( m - 1 )*abs( INCX ) ) otherwise.
             Before entry, the incremented array X must contain the
             vector x.
             Unchanged on exit.

    INCX   - INTEGER.
             On entry, INCX specifies the increment for the elements of
             X. INCX must not be zero.
             Unchanged on exit.

    BETA   - REAL            .
             On entry, BETA specifies the scalar beta. When BETA is
             supplied as zero then Y need not be set on input.
             Unchanged on exit.

    Y      - REAL             array of DIMENSION at least
             ( 1 + ( m - 1 )*abs( INCY ) ) when TRANS = 'N' or 'n'
             and at least
             ( 1 + ( n - 1 )*abs( INCY ) ) otherwise.
             Before entry with BETA non-zero, the incremented array Y
             must contain the vector y. On exit, Y is overwritten by the
             updated vector y.

    INCY   - INTEGER.
             On entry, INCY specifies the increment for the elements of
             Y. INCY must not be zero.
             Unchanged on exit.


    Level 2 Blas routine.

    -- Written on 22-October-1986.
       Jack Dongarra, Argonne National Lab.
       Jeremy Du Croz, Nag Central Office.
       Sven Hammarling, Nag Central Office.
       Richard Hanson, Sandia National Labs.


       Test the input parameters.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;
    --x;
    --y;

    /* Function Body */
    info = 0;
    if (! lsame_(trans, "N") && ! lsame_(trans, "T") && ! lsame_(trans, "C")
	    ) {
	info = 1;
    } else if (*m < 0) {
	info = 2;
    } else if (*n < 0) {
	info = 3;
    } else if (*lda < max(1,*m)) {
	info = 6;
    } else if (*incx == 0) {
	info = 8;
    } else if (*incy == 0) {
	info = 11;
    }
    if (info != 0) {
	xerbla_("SGEMV ", &info);
	return 0;
    }

/*     Quick return if possible. */

    if (*m == 0 || *n == 0 || (*alpha == 0.f && *beta == 1.f)) {
	return 0;
    }

/*
       Set  LENX  and  LENY, the lengths of the vectors x and y, and set
       up the start points in  X  and  Y.
*/

    if (lsame_(trans, "N")) {
	lenx = *n;
	leny = *m;
    } else {
	lenx = *m;
	leny = *n;
    }
    if (*incx > 0) {
	kx = 1;
    } else {
	kx = 1 - (lenx - 1) * *incx;
    }
    if (*incy > 0) {
	ky = 1;
    } else {
	ky = 1 - (leny - 1) * *incy;
    }

/*
       Start the operations. In this version the elements of A are
       accessed sequentially with one pass through A.

       First form  y := beta*y.
*/

    if (*beta != 1.f) {
	if (*incy == 1) {
	    if (*beta == 0.f) {
		i__1 = leny;
		for (i__ = 1; i__ <= i__1; ++i__) {
		    y[i__] = 0.f;
/* L10: */
		}
	    } else {
		i__1 = leny;
		for (i__ = 1; i__ <= i__1; ++i__) {
		    y[i__] = *beta * y[i__];
/* L20: */
		}
	    }
	} else {
	    iy = ky;
	    if (*beta == 0.f) {
		i__1 = leny;
		for (i__ = 1; i__ <= i__1; ++i__) {
		    y[iy] = 0.f;
		    iy += *incy;
/* L30: */
		}
	    } else {
		i__1 = leny;
		for (i__ = 1; i__ <= i__1; ++i__) {
		    y[iy] = *beta * y[iy];
		    iy += *incy;
/* L40: */
		}
	    }
	}
    }
    if (*alpha == 0.f) {
	return 0;
    }
    if (lsame_(trans, "N")) {

/*        Form  y := alpha*A*x + y. */

	jx = kx;
	if (*incy == 1) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		if (x[jx] != 0.f) {
		    temp = *alpha * x[jx];
		    i__2 = *m;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			y[i__] += temp * a[i__ + j * a_dim1];
/* L50: */
		    }
		}
		jx += *incx;
/* L60: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		if (x[jx] != 0.f) {
		    temp = *alpha * x[jx];
		    iy = ky;
		    i__2 = *m;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			y[iy] += temp * a[i__ + j * a_dim1];
			iy += *incy;
/* L70: */
		    }
		}
		jx += *incx;
/* L80: */
	    }
	}
    } else {

/*        Form  y := alpha*A'*x + y. */

	jy = ky;
	if (*incx == 1) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		temp = 0.f;
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    temp += a[i__ + j * a_dim1] * x[i__];
/* L90: */
		}
		y[jy] += *alpha * temp;
		jy += *incy;
/* L100: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		temp = 0.f;
		ix = kx;
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    temp += a[i__ + j * a_dim1] * x[ix];
		    ix += *incx;
/* L110: */
		}
		y[jy] += *alpha * temp;
		jy += *incy;
/* L120: */
	    }
	}
    }

    return 0;

/*     End of SGEMV . */

}